

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  seqDef *psVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong *puVar15;
  int iVar16;
  ulong *puVar17;
  BYTE *pBVar18;
  ulong *puVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  BYTE *pBVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong *puVar31;
  BYTE *pBVar32;
  long lVar33;
  uint uVar34;
  BYTE *pBVar35;
  uint uVar36;
  BYTE *pBVar37;
  U32 UVar38;
  ulong *puVar39;
  BYTE *pInLoopLimit;
  BYTE *local_a0;
  
  puVar4 = (ulong *)((long)src + srcSize);
  puVar31 = (ulong *)((long)src + (srcSize - 8));
  pBVar32 = (ms->window).base + (ms->window).dictLimit;
  uVar5 = rep[1];
  puVar39 = (ulong *)((ulong)(pBVar32 == (BYTE *)src) + (long)src);
  uVar20 = (int)puVar39 - (int)pBVar32;
  uVar30 = (ulong)uVar5;
  if (uVar20 < uVar5) {
    uVar30 = 0;
  }
  uVar27 = (uint)uVar30;
  uVar6 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar13 = (ulong)uVar6;
  if (uVar20 < uVar6) {
    uVar13 = 0;
  }
  uVar12 = (uint)uVar13;
  if (puVar39 < puVar31) {
    puVar1 = (ulong *)((long)puVar4 - 7);
    puVar2 = (ulong *)((long)puVar4 - 3);
    puVar3 = (ulong *)((long)puVar4 - 1);
    do {
      iVar21 = (int)uVar13;
      lVar33 = -uVar13;
      if (iVar21 == 0) {
        pBVar37 = (BYTE *)0x0;
      }
      else {
        pBVar37 = (BYTE *)0x0;
        if (*(int *)((long)puVar39 + 1) == *(int *)(((long)puVar39 + 1) - uVar13)) {
          puVar25 = (ulong *)((long)puVar39 + 5);
          puVar14 = (ulong *)((long)puVar39 + lVar33 + 5);
          puVar19 = puVar25;
          if (puVar25 < puVar1) {
            uVar24 = *puVar25 ^ *puVar14;
            uVar22 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            pBVar37 = (BYTE *)(uVar22 >> 3 & 0x1fffffff);
            if (*puVar14 == *puVar25) {
              puVar19 = (ulong *)((long)puVar39 + 0xd);
              puVar14 = (ulong *)((long)puVar39 + lVar33 + 0xd);
              do {
                if (puVar1 <= puVar19) goto LAB_00196625;
                uVar22 = *puVar14;
                uVar24 = *puVar19;
                uVar26 = uVar24 ^ uVar22;
                uVar28 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                pBVar37 = (BYTE *)((long)puVar19 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar25));
                puVar19 = puVar19 + 1;
                puVar14 = puVar14 + 1;
              } while (uVar22 == uVar24);
            }
          }
          else {
LAB_00196625:
            if ((puVar19 < puVar2) && ((int)*puVar14 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar14 = (ulong *)((long)puVar14 + 4);
            }
            if ((puVar19 < puVar3) && ((short)*puVar14 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar14 = (ulong *)((long)puVar14 + 2);
            }
            if (puVar19 < puVar4) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar19));
            }
            pBVar37 = (BYTE *)((long)puVar19 - (long)puVar25);
          }
          pBVar37 = pBVar37 + 4;
        }
      }
      iVar16 = (int)puVar39;
      if (cParams->searchLength - 6 < 2) {
        pUVar8 = ms->chainTable;
        uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar18 = (ms->window).base;
        uVar27 = (ms->window).lowLimit;
        uVar36 = iVar16 - (int)pBVar18;
        uVar12 = uVar36 - uVar34;
        if (uVar36 < uVar34) {
          uVar12 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar39,6);
        if (uVar11 <= uVar27) goto LAB_00196b86;
        iVar16 = 1 << ((byte)uVar7 & 0x1f);
        uVar22 = 99999999;
        pBVar35 = (BYTE *)0x3;
        do {
          puVar25 = (ulong *)(pBVar18 + uVar11);
          if (pBVar35[(long)puVar25] == *(BYTE *)((long)puVar39 + (long)pBVar35)) {
            puVar19 = puVar39;
            if (puVar39 < puVar1) {
              uVar28 = *puVar39 ^ *puVar25;
              uVar24 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              pBVar23 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
              if (*puVar25 == *puVar39) {
                do {
                  puVar19 = puVar19 + 1;
                  puVar25 = puVar25 + 1;
                  if (puVar1 <= puVar19) goto LAB_001967a2;
                  uVar28 = *puVar19 ^ *puVar25;
                  uVar24 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                    }
                  }
                  pBVar23 = (BYTE *)((long)puVar19 + ((uVar24 >> 3 & 0x1fffffff) - (long)puVar39));
                } while (*puVar25 == *puVar19);
              }
            }
            else {
LAB_001967a2:
              if ((puVar19 < puVar2) && ((int)*puVar25 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar25 = (ulong *)((long)puVar25 + 4);
              }
              if ((puVar19 < puVar3) && ((short)*puVar25 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar25 = (ulong *)((long)puVar25 + 2);
              }
              if (puVar19 < puVar4) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar19));
              }
              pBVar23 = (BYTE *)((long)puVar19 - (long)puVar39);
            }
          }
          else {
            pBVar23 = (BYTE *)0x0;
          }
          if ((pBVar35 < pBVar23) &&
             (uVar22 = (ulong)((uVar36 + 2) - uVar11), pBVar35 = pBVar23,
             (ulong *)((long)puVar39 + (long)pBVar23) == puVar4)) {
            bVar10 = false;
          }
          else {
            pBVar23 = pBVar35;
            if (uVar12 < uVar11) {
              uVar11 = pUVar8[uVar11 & uVar34 - 1];
              bVar10 = true;
            }
            else {
              bVar10 = false;
            }
          }
        } while (((bVar10) && (uVar27 < uVar11)) &&
                (iVar16 = iVar16 + -1, pBVar35 = pBVar23, iVar16 != 0));
      }
      else if (cParams->searchLength == 5) {
        pUVar8 = ms->chainTable;
        uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar18 = (ms->window).base;
        uVar27 = (ms->window).lowLimit;
        uVar36 = iVar16 - (int)pBVar18;
        uVar12 = uVar36 - uVar34;
        if (uVar36 < uVar34) {
          uVar12 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar39,5);
        if (uVar27 < uVar11) {
          iVar16 = 1 << ((byte)uVar7 & 0x1f);
          uVar22 = 99999999;
          pBVar35 = (BYTE *)0x3;
          do {
            puVar25 = (ulong *)(pBVar18 + uVar11);
            if (pBVar35[(long)puVar25] == *(BYTE *)((long)puVar39 + (long)pBVar35)) {
              puVar19 = puVar39;
              if (puVar39 < puVar1) {
                uVar28 = *puVar39 ^ *puVar25;
                uVar24 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                pBVar23 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
                if (*puVar25 == *puVar39) {
                  do {
                    puVar19 = puVar19 + 1;
                    puVar25 = puVar25 + 1;
                    if (puVar1 <= puVar19) goto LAB_0019694e;
                    uVar28 = *puVar19 ^ *puVar25;
                    uVar24 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                      }
                    }
                    pBVar23 = (BYTE *)((long)puVar19 + ((uVar24 >> 3 & 0x1fffffff) - (long)puVar39))
                    ;
                  } while (*puVar25 == *puVar19);
                }
              }
              else {
LAB_0019694e:
                if ((puVar19 < puVar2) && ((int)*puVar25 == (int)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar25 = (ulong *)((long)puVar25 + 4);
                }
                if ((puVar19 < puVar3) && ((short)*puVar25 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar25 = (ulong *)((long)puVar25 + 2);
                }
                if (puVar19 < puVar4) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar19));
                }
                pBVar23 = (BYTE *)((long)puVar19 - (long)puVar39);
              }
            }
            else {
              pBVar23 = (BYTE *)0x0;
            }
            if ((pBVar35 < pBVar23) &&
               (uVar22 = (ulong)((uVar36 + 2) - uVar11), pBVar35 = pBVar23,
               (ulong *)((long)puVar39 + (long)pBVar23) == puVar4)) {
              bVar10 = false;
            }
            else {
              pBVar23 = pBVar35;
              if (uVar12 < uVar11) {
                uVar11 = pUVar8[uVar11 & uVar34 - 1];
                bVar10 = true;
              }
              else {
                bVar10 = false;
              }
            }
          } while (((bVar10) && (uVar27 < uVar11)) &&
                  (iVar16 = iVar16 + -1, pBVar35 = pBVar23, iVar16 != 0));
        }
        else {
LAB_00196b86:
          pBVar23 = (BYTE *)0x3;
          uVar22 = 99999999;
        }
      }
      else {
        pUVar8 = ms->chainTable;
        uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar18 = (ms->window).base;
        uVar27 = (ms->window).lowLimit;
        uVar36 = iVar16 - (int)pBVar18;
        uVar12 = uVar36 - uVar34;
        if (uVar36 < uVar34) {
          uVar12 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar39,4);
        if (uVar11 <= uVar27) goto LAB_00196b86;
        iVar16 = 1 << ((byte)uVar7 & 0x1f);
        uVar22 = 99999999;
        pBVar35 = (BYTE *)0x3;
        do {
          puVar25 = (ulong *)(pBVar18 + uVar11);
          if (pBVar35[(long)puVar25] == *(BYTE *)((long)puVar39 + (long)pBVar35)) {
            puVar19 = puVar39;
            if (puVar39 < puVar1) {
              uVar28 = *puVar39 ^ *puVar25;
              uVar24 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              pBVar23 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
              if (*puVar25 == *puVar39) {
                do {
                  puVar19 = puVar19 + 1;
                  puVar25 = puVar25 + 1;
                  if (puVar1 <= puVar19) goto LAB_00196af1;
                  uVar28 = *puVar19 ^ *puVar25;
                  uVar24 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                    }
                  }
                  pBVar23 = (BYTE *)((long)puVar19 + ((uVar24 >> 3 & 0x1fffffff) - (long)puVar39));
                } while (*puVar25 == *puVar19);
              }
            }
            else {
LAB_00196af1:
              if ((puVar19 < puVar2) && ((int)*puVar25 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar25 = (ulong *)((long)puVar25 + 4);
              }
              if ((puVar19 < puVar3) && ((short)*puVar25 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar25 = (ulong *)((long)puVar25 + 2);
              }
              if (puVar19 < puVar4) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar19));
              }
              pBVar23 = (BYTE *)((long)puVar19 - (long)puVar39);
            }
          }
          else {
            pBVar23 = (BYTE *)0x0;
          }
          if ((pBVar35 < pBVar23) &&
             (uVar22 = (ulong)((uVar36 + 2) - uVar11), pBVar35 = pBVar23,
             (ulong *)((long)puVar39 + (long)pBVar23) == puVar4)) {
            bVar10 = false;
          }
          else {
            pBVar23 = pBVar35;
            if (uVar12 < uVar11) {
              uVar11 = pUVar8[uVar11 & uVar34 - 1];
              bVar10 = true;
            }
            else {
              bVar10 = false;
            }
          }
        } while (((bVar10) && (uVar27 < uVar11)) &&
                (iVar16 = iVar16 + -1, pBVar35 = pBVar23, iVar16 != 0));
      }
      local_a0 = pBVar37;
      if (pBVar37 < pBVar23) {
        local_a0 = pBVar23;
      }
      if (local_a0 < (BYTE *)0x4) {
        puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + 1);
      }
      else {
        puVar25 = puVar39;
        if (pBVar23 <= pBVar37) {
          uVar22 = 0;
          puVar39 = (ulong *)((long)puVar39 + 1);
        }
        do {
          do {
            puVar19 = puVar25;
            if (puVar31 <= puVar19) goto LAB_0019795f;
            puVar25 = (ulong *)((long)puVar19 + 1);
            if (uVar22 == 0) {
              uVar22 = 0;
            }
            else if ((iVar21 != 0) && (*(int *)puVar25 == *(int *)((long)puVar25 + lVar33))) {
              puVar14 = (ulong *)((long)puVar19 + 5);
              puVar15 = (ulong *)((long)puVar19 + lVar33 + 5);
              puVar17 = puVar14;
              if (puVar14 < puVar1) {
                uVar28 = *puVar14 ^ *puVar15;
                uVar24 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                pBVar37 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
                if (*puVar15 == *puVar14) {
                  puVar17 = (ulong *)((long)puVar19 + 0xd);
                  puVar15 = (ulong *)((long)puVar19 + lVar33 + 0xd);
                  do {
                    if (puVar1 <= puVar17) goto LAB_00196caf;
                    uVar24 = *puVar15;
                    uVar28 = *puVar17;
                    uVar29 = uVar28 ^ uVar24;
                    uVar26 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    pBVar37 = (BYTE *)((long)puVar17 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar14))
                    ;
                    puVar17 = puVar17 + 1;
                    puVar15 = puVar15 + 1;
                  } while (uVar24 == uVar28);
                }
              }
              else {
LAB_00196caf:
                if ((puVar17 < puVar2) && ((int)*puVar15 == (int)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 4);
                  puVar15 = (ulong *)((long)puVar15 + 4);
                }
                if ((puVar17 < puVar3) && ((short)*puVar15 == (short)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 2);
                  puVar15 = (ulong *)((long)puVar15 + 2);
                }
                if (puVar17 < puVar4) {
                  puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar15 == (BYTE)*puVar17));
                }
                pBVar37 = (BYTE *)((long)puVar17 - (long)puVar14);
              }
              if (pBVar37 < (BYTE *)0xfffffffffffffffc) {
                uVar12 = (int)uVar22 + 1;
                uVar27 = 0x1f;
                if (uVar12 != 0) {
                  for (; uVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                  }
                }
                if ((int)((uVar27 ^ 0x1f) + (int)local_a0 * 3 + -0x1e) < (int)(pBVar37 + 4) * 3) {
                  uVar22 = 0;
                  puVar39 = puVar25;
                  local_a0 = pBVar37 + 4;
                }
              }
            }
            iVar16 = (int)puVar25;
            if (cParams->searchLength - 6 < 2) {
              pUVar8 = ms->chainTable;
              uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
              pBVar37 = (ms->window).base;
              uVar27 = (ms->window).lowLimit;
              uVar36 = iVar16 - (int)pBVar37;
              uVar12 = uVar36 - uVar34;
              if (uVar36 < uVar34) {
                uVar12 = 0;
              }
              uVar7 = cParams->searchLog;
              uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar25,6);
              if (uVar11 <= uVar27) goto LAB_0019723a;
              iVar16 = 1 << ((byte)uVar7 & 0x1f);
              uVar24 = 99999999;
              pBVar18 = (BYTE *)0x3;
              do {
                puVar14 = (ulong *)(pBVar37 + uVar11);
                if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar25 + (long)pBVar18)) {
                  puVar17 = puVar25;
                  if (puVar25 < puVar1) {
                    uVar26 = *puVar25 ^ *puVar14;
                    uVar28 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    pBVar35 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                    puVar17 = (ulong *)((long)puVar19 + 9);
                    if (*puVar14 == *puVar25) {
                      do {
                        puVar14 = puVar14 + 1;
                        if (puVar1 <= puVar17) goto LAB_00196e48;
                        uVar28 = *puVar17;
                        uVar29 = uVar28 ^ *puVar14;
                        uVar26 = 0;
                        if (uVar29 != 0) {
                          for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                          }
                        }
                        pBVar35 = (BYTE *)((long)puVar17 +
                                          ((uVar26 >> 3 & 0x1fffffff) - (long)puVar25));
                        puVar17 = puVar17 + 1;
                      } while (*puVar14 == uVar28);
                    }
                  }
                  else {
LAB_00196e48:
                    if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 4);
                      puVar14 = (ulong *)((long)puVar14 + 4);
                    }
                    if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 2);
                      puVar14 = (ulong *)((long)puVar14 + 2);
                    }
                    if (puVar17 < puVar4) {
                      puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar17))
                      ;
                    }
                    pBVar35 = (BYTE *)((long)puVar17 - (long)puVar25);
                  }
                }
                else {
                  pBVar35 = (BYTE *)0x0;
                }
                if ((pBVar18 < pBVar35) &&
                   (uVar24 = (ulong)((uVar36 + 2) - uVar11), pBVar18 = pBVar35,
                   (ulong *)((long)puVar25 + (long)pBVar35) == puVar4)) {
                  bVar10 = false;
                }
                else {
                  pBVar35 = pBVar18;
                  if (uVar12 < uVar11) {
                    uVar11 = pUVar8[uVar11 & uVar34 - 1];
                    bVar10 = true;
                  }
                  else {
                    bVar10 = false;
                  }
                }
              } while (((bVar10) && (uVar27 < uVar11)) &&
                      (iVar16 = iVar16 + -1, pBVar18 = pBVar35, iVar16 != 0));
            }
            else if (cParams->searchLength == 5) {
              pUVar8 = ms->chainTable;
              uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
              pBVar37 = (ms->window).base;
              uVar27 = (ms->window).lowLimit;
              uVar34 = iVar16 - (int)pBVar37;
              uVar12 = uVar34 - uVar36;
              if (uVar34 < uVar36) {
                uVar12 = 0;
              }
              uVar7 = cParams->searchLog;
              uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar25,5);
              if (uVar27 < uVar11) {
                iVar16 = 1 << ((byte)uVar7 & 0x1f);
                uVar24 = 99999999;
                pBVar18 = (BYTE *)0x3;
                do {
                  puVar14 = (ulong *)(pBVar37 + uVar11);
                  if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar25 + (long)pBVar18)) {
                    puVar17 = puVar25;
                    if (puVar25 < puVar1) {
                      uVar26 = *puVar25 ^ *puVar14;
                      uVar28 = 0;
                      if (uVar26 != 0) {
                        for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      pBVar35 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                      puVar17 = (ulong *)((long)puVar19 + 9);
                      if (*puVar14 == *puVar25) {
                        do {
                          puVar14 = puVar14 + 1;
                          if (puVar1 <= puVar17) goto LAB_00196ff8;
                          uVar28 = *puVar17;
                          uVar29 = uVar28 ^ *puVar14;
                          uVar26 = 0;
                          if (uVar29 != 0) {
                            for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                            }
                          }
                          pBVar35 = (BYTE *)((long)puVar17 +
                                            ((uVar26 >> 3 & 0x1fffffff) - (long)puVar25));
                          puVar17 = puVar17 + 1;
                        } while (*puVar14 == uVar28);
                      }
                    }
                    else {
LAB_00196ff8:
                      if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                        puVar17 = (ulong *)((long)puVar17 + 4);
                        puVar14 = (ulong *)((long)puVar14 + 4);
                      }
                      if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                        puVar17 = (ulong *)((long)puVar17 + 2);
                        puVar14 = (ulong *)((long)puVar14 + 2);
                      }
                      if (puVar17 < puVar4) {
                        puVar17 = (ulong *)((long)puVar17 +
                                           (ulong)((BYTE)*puVar14 == (BYTE)*puVar17));
                      }
                      pBVar35 = (BYTE *)((long)puVar17 - (long)puVar25);
                    }
                  }
                  else {
                    pBVar35 = (BYTE *)0x0;
                  }
                  if ((pBVar18 < pBVar35) &&
                     (uVar24 = (ulong)((uVar34 + 2) - uVar11), pBVar18 = pBVar35,
                     (ulong *)((long)puVar25 + (long)pBVar35) == puVar4)) {
                    bVar10 = false;
                  }
                  else {
                    pBVar35 = pBVar18;
                    if (uVar12 < uVar11) {
                      uVar11 = pUVar8[uVar11 & uVar36 - 1];
                      bVar10 = true;
                    }
                    else {
                      bVar10 = false;
                    }
                  }
                } while (((bVar10) && (uVar27 < uVar11)) &&
                        (iVar16 = iVar16 + -1, pBVar18 = pBVar35, iVar16 != 0));
              }
              else {
LAB_0019723a:
                pBVar35 = (BYTE *)0x3;
                uVar24 = 99999999;
              }
            }
            else {
              pUVar8 = ms->chainTable;
              uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
              pBVar37 = (ms->window).base;
              uVar27 = (ms->window).lowLimit;
              uVar34 = iVar16 - (int)pBVar37;
              uVar12 = uVar34 - uVar36;
              if (uVar34 < uVar36) {
                uVar12 = 0;
              }
              uVar7 = cParams->searchLog;
              uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar25,4);
              if (uVar11 <= uVar27) goto LAB_0019723a;
              iVar16 = 1 << ((byte)uVar7 & 0x1f);
              uVar24 = 99999999;
              pBVar18 = (BYTE *)0x3;
              do {
                puVar14 = (ulong *)(pBVar37 + uVar11);
                if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar25 + (long)pBVar18)) {
                  puVar17 = puVar25;
                  if (puVar25 < puVar1) {
                    uVar26 = *puVar25 ^ *puVar14;
                    uVar28 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    pBVar35 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                    puVar17 = (ulong *)((long)puVar19 + 9);
                    if (*puVar14 == *puVar25) {
                      do {
                        puVar14 = puVar14 + 1;
                        if (puVar1 <= puVar17) goto LAB_001971a0;
                        uVar28 = *puVar17;
                        uVar29 = uVar28 ^ *puVar14;
                        uVar26 = 0;
                        if (uVar29 != 0) {
                          for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                          }
                        }
                        pBVar35 = (BYTE *)((long)puVar17 +
                                          ((uVar26 >> 3 & 0x1fffffff) - (long)puVar25));
                        puVar17 = puVar17 + 1;
                      } while (*puVar14 == uVar28);
                    }
                  }
                  else {
LAB_001971a0:
                    if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 4);
                      puVar14 = (ulong *)((long)puVar14 + 4);
                    }
                    if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 2);
                      puVar14 = (ulong *)((long)puVar14 + 2);
                    }
                    if (puVar17 < puVar4) {
                      puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar17))
                      ;
                    }
                    pBVar35 = (BYTE *)((long)puVar17 - (long)puVar25);
                  }
                }
                else {
                  pBVar35 = (BYTE *)0x0;
                }
                if ((pBVar18 < pBVar35) &&
                   (uVar24 = (ulong)((uVar34 + 2) - uVar11), pBVar18 = pBVar35,
                   (ulong *)((long)puVar25 + (long)pBVar35) == puVar4)) {
                  bVar10 = false;
                }
                else {
                  pBVar35 = pBVar18;
                  if (uVar12 < uVar11) {
                    uVar11 = pUVar8[uVar11 & uVar36 - 1];
                    bVar10 = true;
                  }
                  else {
                    bVar10 = false;
                  }
                }
              } while (((bVar10) && (uVar27 < uVar11)) &&
                      (iVar16 = iVar16 + -1, pBVar18 = pBVar35, iVar16 != 0));
            }
            bVar10 = true;
            if ((BYTE *)0x3 < pBVar35) {
              uVar12 = (int)uVar22 + 1;
              uVar27 = 0x1f;
              if (uVar12 != 0) {
                for (; uVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                }
              }
              uVar12 = (int)uVar24 + 1;
              iVar16 = 0x1f;
              if (uVar12 != 0) {
                for (; uVar12 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                }
              }
              if ((int)((uVar27 ^ 0x1f) + (int)local_a0 * 4 + -0x1b) < (int)pBVar35 * 4 - iVar16) {
                bVar10 = false;
                puVar39 = puVar25;
                uVar22 = uVar24;
                local_a0 = pBVar35;
              }
            }
          } while (!bVar10);
          if (puVar31 <= puVar25) break;
          puVar25 = (ulong *)((long)puVar19 + 2);
          if (uVar22 == 0) {
            uVar22 = 0;
          }
          else if ((iVar21 != 0) && (*(int *)puVar25 == *(int *)((long)puVar25 + lVar33))) {
            puVar14 = (ulong *)((long)puVar19 + 6);
            puVar15 = (ulong *)((long)puVar19 + lVar33 + 6);
            puVar17 = puVar14;
            if (puVar14 < puVar1) {
              uVar28 = *puVar14 ^ *puVar15;
              uVar24 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              pBVar37 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
              if (*puVar15 == *puVar14) {
                puVar17 = (ulong *)((long)puVar19 + 0xe);
                puVar15 = (ulong *)((long)puVar19 + lVar33 + 0xe);
                do {
                  if (puVar1 <= puVar17) goto LAB_00197370;
                  uVar24 = *puVar15;
                  uVar28 = *puVar17;
                  uVar29 = uVar28 ^ uVar24;
                  uVar26 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  pBVar37 = (BYTE *)((long)puVar17 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar14));
                  puVar17 = puVar17 + 1;
                  puVar15 = puVar15 + 1;
                } while (uVar24 == uVar28);
              }
            }
            else {
LAB_00197370:
              if ((puVar17 < puVar2) && ((int)*puVar15 == (int)*puVar17)) {
                puVar17 = (ulong *)((long)puVar17 + 4);
                puVar15 = (ulong *)((long)puVar15 + 4);
              }
              if ((puVar17 < puVar3) && ((short)*puVar15 == (short)*puVar17)) {
                puVar17 = (ulong *)((long)puVar17 + 2);
                puVar15 = (ulong *)((long)puVar15 + 2);
              }
              if (puVar17 < puVar4) {
                puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar15 == (BYTE)*puVar17));
              }
              pBVar37 = (BYTE *)((long)puVar17 - (long)puVar14);
            }
            if (pBVar37 < (BYTE *)0xfffffffffffffffc) {
              uVar12 = (int)uVar22 + 1;
              uVar27 = 0x1f;
              if (uVar12 != 0) {
                for (; uVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                }
              }
              if ((int)((uVar27 ^ 0x1f) + (int)local_a0 * 4 + -0x1e) < (int)(pBVar37 + 4) * 4) {
                uVar22 = 0;
                puVar39 = puVar25;
                local_a0 = pBVar37 + 4;
              }
            }
          }
          iVar16 = (int)puVar25;
          if (cParams->searchLength - 6 < 2) {
            pUVar8 = ms->chainTable;
            uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar37 = (ms->window).base;
            uVar27 = (ms->window).lowLimit;
            uVar34 = iVar16 - (int)pBVar37;
            uVar12 = uVar34 - uVar36;
            if (uVar34 < uVar36) {
              uVar12 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar25,6);
            if (uVar11 <= uVar27) goto LAB_001978dd;
            iVar16 = 1 << ((byte)uVar7 & 0x1f);
            uVar24 = 99999999;
            pBVar18 = (BYTE *)0x3;
            do {
              puVar14 = (ulong *)(pBVar37 + uVar11);
              if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar25 + (long)pBVar18)) {
                puVar17 = puVar25;
                if (puVar25 < puVar1) {
                  uVar26 = *puVar25 ^ *puVar14;
                  uVar28 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  pBVar35 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                  puVar17 = (ulong *)((long)puVar19 + 10);
                  if (*puVar14 == *puVar25) {
                    do {
                      puVar14 = puVar14 + 1;
                      if (puVar1 <= puVar17) goto LAB_00197502;
                      uVar28 = *puVar17;
                      uVar29 = uVar28 ^ *puVar14;
                      uVar26 = 0;
                      if (uVar29 != 0) {
                        for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      pBVar35 = (BYTE *)((long)puVar17 +
                                        ((uVar26 >> 3 & 0x1fffffff) - (long)puVar25));
                      puVar17 = puVar17 + 1;
                    } while (*puVar14 == uVar28);
                  }
                }
                else {
LAB_00197502:
                  if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 4);
                    puVar14 = (ulong *)((long)puVar14 + 4);
                  }
                  if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 2);
                    puVar14 = (ulong *)((long)puVar14 + 2);
                  }
                  if (puVar17 < puVar4) {
                    puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar17));
                  }
                  pBVar35 = (BYTE *)((long)puVar17 - (long)puVar25);
                }
              }
              else {
                pBVar35 = (BYTE *)0x0;
              }
              if ((pBVar18 < pBVar35) &&
                 (uVar24 = (ulong)((uVar34 + 2) - uVar11), pBVar18 = pBVar35,
                 (ulong *)((long)puVar25 + (long)pBVar35) == puVar4)) {
                bVar10 = false;
              }
              else {
                pBVar35 = pBVar18;
                if (uVar12 < uVar11) {
                  uVar11 = pUVar8[uVar11 & uVar36 - 1];
                  bVar10 = true;
                }
                else {
                  bVar10 = false;
                }
              }
            } while (((bVar10) && (uVar27 < uVar11)) &&
                    (iVar16 = iVar16 + -1, pBVar18 = pBVar35, iVar16 != 0));
          }
          else if (cParams->searchLength == 5) {
            pUVar8 = ms->chainTable;
            uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar37 = (ms->window).base;
            uVar27 = (ms->window).lowLimit;
            uVar34 = iVar16 - (int)pBVar37;
            uVar12 = uVar34 - uVar36;
            if (uVar34 < uVar36) {
              uVar12 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar25,5);
            if (uVar27 < uVar11) {
              iVar16 = 1 << ((byte)uVar7 & 0x1f);
              uVar24 = 99999999;
              pBVar18 = (BYTE *)0x3;
              do {
                puVar14 = (ulong *)(pBVar37 + uVar11);
                if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar25 + (long)pBVar18)) {
                  puVar17 = puVar25;
                  if (puVar25 < puVar1) {
                    uVar26 = *puVar25 ^ *puVar14;
                    uVar28 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    pBVar35 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                    puVar17 = (ulong *)((long)puVar19 + 10);
                    if (*puVar14 == *puVar25) {
                      do {
                        puVar14 = puVar14 + 1;
                        if (puVar1 <= puVar17) goto LAB_001976a8;
                        uVar28 = *puVar17;
                        uVar29 = uVar28 ^ *puVar14;
                        uVar26 = 0;
                        if (uVar29 != 0) {
                          for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                          }
                        }
                        pBVar35 = (BYTE *)((long)puVar17 +
                                          ((uVar26 >> 3 & 0x1fffffff) - (long)puVar25));
                        puVar17 = puVar17 + 1;
                      } while (*puVar14 == uVar28);
                    }
                  }
                  else {
LAB_001976a8:
                    if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 4);
                      puVar14 = (ulong *)((long)puVar14 + 4);
                    }
                    if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 2);
                      puVar14 = (ulong *)((long)puVar14 + 2);
                    }
                    if (puVar17 < puVar4) {
                      puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar17))
                      ;
                    }
                    pBVar35 = (BYTE *)((long)puVar17 - (long)puVar25);
                  }
                }
                else {
                  pBVar35 = (BYTE *)0x0;
                }
                if ((pBVar18 < pBVar35) &&
                   (uVar24 = (ulong)((uVar34 + 2) - uVar11), pBVar18 = pBVar35,
                   (ulong *)((long)puVar25 + (long)pBVar35) == puVar4)) {
                  bVar10 = false;
                }
                else {
                  pBVar35 = pBVar18;
                  if (uVar12 < uVar11) {
                    uVar11 = pUVar8[uVar11 & uVar36 - 1];
                    bVar10 = true;
                  }
                  else {
                    bVar10 = false;
                  }
                }
              } while (((bVar10) && (uVar27 < uVar11)) &&
                      (iVar16 = iVar16 + -1, pBVar18 = pBVar35, iVar16 != 0));
            }
            else {
LAB_001978dd:
              pBVar35 = (BYTE *)0x3;
              uVar24 = 99999999;
            }
          }
          else {
            pUVar8 = ms->chainTable;
            uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar37 = (ms->window).base;
            uVar27 = (ms->window).lowLimit;
            uVar34 = iVar16 - (int)pBVar37;
            uVar12 = uVar34 - uVar36;
            if (uVar34 < uVar36) {
              uVar12 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)puVar25,4);
            if (uVar11 <= uVar27) goto LAB_001978dd;
            iVar16 = 1 << ((byte)uVar7 & 0x1f);
            uVar24 = 99999999;
            pBVar18 = (BYTE *)0x3;
            do {
              puVar14 = (ulong *)(pBVar37 + uVar11);
              if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar25 + (long)pBVar18)) {
                puVar17 = puVar25;
                if (puVar25 < puVar1) {
                  uVar26 = *puVar25 ^ *puVar14;
                  uVar28 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  pBVar35 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                  puVar17 = (ulong *)((long)puVar19 + 10);
                  if (*puVar14 == *puVar25) {
                    do {
                      puVar14 = puVar14 + 1;
                      if (puVar1 <= puVar17) goto LAB_00197845;
                      uVar28 = *puVar17;
                      uVar29 = uVar28 ^ *puVar14;
                      uVar26 = 0;
                      if (uVar29 != 0) {
                        for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      pBVar35 = (BYTE *)((long)puVar17 +
                                        ((uVar26 >> 3 & 0x1fffffff) - (long)puVar25));
                      puVar17 = puVar17 + 1;
                    } while (*puVar14 == uVar28);
                  }
                }
                else {
LAB_00197845:
                  if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 4);
                    puVar14 = (ulong *)((long)puVar14 + 4);
                  }
                  if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 2);
                    puVar14 = (ulong *)((long)puVar14 + 2);
                  }
                  if (puVar17 < puVar4) {
                    puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar17));
                  }
                  pBVar35 = (BYTE *)((long)puVar17 - (long)puVar25);
                }
              }
              else {
                pBVar35 = (BYTE *)0x0;
              }
              if ((pBVar18 < pBVar35) &&
                 (uVar24 = (ulong)((uVar34 + 2) - uVar11), pBVar18 = pBVar35,
                 (ulong *)((long)puVar25 + (long)pBVar35) == puVar4)) {
                bVar10 = false;
              }
              else {
                pBVar35 = pBVar18;
                if (uVar12 < uVar11) {
                  uVar11 = pUVar8[uVar11 & uVar36 - 1];
                  bVar10 = true;
                }
                else {
                  bVar10 = false;
                }
              }
            } while (((bVar10) && (uVar27 < uVar11)) &&
                    (iVar16 = iVar16 + -1, pBVar18 = pBVar35, iVar16 != 0));
          }
          bVar10 = true;
          if ((BYTE *)0x3 < pBVar35) {
            uVar12 = (int)uVar22 + 1;
            uVar27 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
              }
            }
            uVar12 = (int)uVar24 + 1;
            iVar16 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> iVar16 == 0; iVar16 = iVar16 + -1) {
              }
            }
            if ((int)((uVar27 ^ 0x1f) + (int)local_a0 * 4 + -0x18) < (int)pBVar35 * 4 - iVar16) {
              bVar10 = false;
              puVar39 = puVar25;
              uVar22 = uVar24;
              local_a0 = pBVar35;
            }
          }
        } while (!bVar10);
LAB_0019795f:
        if (uVar22 == 0) {
          UVar38 = 1;
          uVar22 = uVar13;
        }
        else {
          if ((src < puVar39) && (pBVar32 < (BYTE *)((long)puVar39 + (2 - uVar22)))) {
            puVar25 = puVar39;
            while (puVar39 = puVar25,
                  *(BYTE *)((long)puVar25 + -1) == *(BYTE *)((long)puVar25 + (1 - uVar22))) {
              puVar39 = (ulong *)((long)puVar25 + -1);
              local_a0 = local_a0 + 1;
              if ((puVar39 <= src) ||
                 (pBVar37 = (BYTE *)((long)puVar25 + (1 - uVar22)), puVar25 = puVar39,
                 pBVar37 <= pBVar32)) break;
            }
          }
          UVar38 = (int)uVar22 + 1;
          uVar22 = (ulong)((int)uVar22 - 2);
          uVar30 = uVar13;
        }
        uVar13 = (long)puVar39 - (long)src;
        puVar19 = (ulong *)seqStore->lit;
        puVar25 = (ulong *)((long)puVar19 + uVar13);
        do {
          *puVar19 = *src;
          puVar19 = puVar19 + 1;
          src = (void *)((long)src + 8);
        } while (puVar19 < puVar25);
        seqStore->lit = seqStore->lit + uVar13;
        if (0xffff < uVar13) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar9 = seqStore->sequences;
        psVar9->litLength = (U16)uVar13;
        psVar9->offset = UVar38;
        if ((BYTE *)0xffff < local_a0 + -3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar9->matchLength = (U16)(local_a0 + -3);
        seqStore->sequences = psVar9 + 1;
        src = (void *)((long)puVar39 + (long)local_a0);
        uVar13 = uVar22;
        puVar39 = (ulong *)src;
        if (((int)uVar30 != 0) && (src <= puVar31)) {
          while (uVar24 = uVar22, uVar22 = uVar30, uVar13 = uVar24, uVar30 = uVar22,
                puVar39 = (ulong *)src, (int)*src == *(int *)((long)src - uVar22)) {
            puVar39 = (ulong *)((long)src + 4);
            puVar19 = (ulong *)((long)src + (4 - uVar22));
            puVar25 = puVar39;
            if (puVar39 < puVar1) {
              uVar13 = *puVar39 ^ *puVar19;
              uVar30 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              pBVar37 = (BYTE *)(uVar30 >> 3 & 0x1fffffff);
              if (*puVar19 == *puVar39) {
                puVar25 = (ulong *)((long)src + 0xc);
                puVar19 = (ulong *)((long)src + (0xc - uVar22));
                do {
                  if (puVar1 <= puVar25) goto LAB_00197b08;
                  uVar30 = *puVar19;
                  uVar13 = *puVar25;
                  uVar26 = uVar13 ^ uVar30;
                  uVar28 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  pBVar37 = (BYTE *)((long)puVar25 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar39));
                  puVar25 = puVar25 + 1;
                  puVar19 = puVar19 + 1;
                } while (uVar30 == uVar13);
              }
            }
            else {
LAB_00197b08:
              if ((puVar25 < puVar2) && ((int)*puVar19 == (int)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 4);
                puVar19 = (ulong *)((long)puVar19 + 4);
              }
              if ((puVar25 < puVar3) && ((short)*puVar19 == (short)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 2);
                puVar19 = (ulong *)((long)puVar19 + 2);
              }
              if (puVar25 < puVar4) {
                puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar25));
              }
              pBVar37 = (BYTE *)((long)puVar25 - (long)puVar39);
            }
            *(ulong *)seqStore->lit = *src;
            psVar9 = seqStore->sequences;
            psVar9->litLength = 0;
            psVar9->offset = 1;
            if ((BYTE *)0xffff < pBVar37 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar9->matchLength = (U16)(pBVar37 + 1);
            seqStore->sequences = psVar9 + 1;
            src = (void *)((long)src + (long)(pBVar37 + 4));
            uVar13 = uVar22;
            uVar30 = uVar24;
            puVar39 = (ulong *)src;
            if (((int)uVar24 == 0) || (puVar31 < src)) break;
          }
        }
      }
      uVar27 = (uint)uVar30;
      uVar12 = (uint)uVar13;
    } while (puVar39 < puVar31);
  }
  uVar34 = 0;
  if (uVar20 < uVar5) {
    uVar34 = uVar5;
  }
  if (uVar20 < uVar6) {
    uVar34 = uVar6;
  }
  if (uVar12 == 0) {
    uVar12 = uVar34;
  }
  if (uVar27 != 0) {
    uVar34 = uVar27;
  }
  *rep = uVar12;
  rep[1] = uVar34;
  return (long)puVar4 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 2);
}